

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islower.c
# Opt level: O0

int main(void)

{
  ushort **ppuVar1;
  
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x61] & 0x200) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/islower.c, line %d - %s\n"
           ,0x1a,"islower( \'a\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x7a] & 0x200) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/islower.c, line %d - %s\n"
           ,0x1b,"islower( \'z\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x41] & 0x200) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/islower.c, line %d - %s\n"
           ,0x1c,"! islower( \'A\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x5a] & 0x200) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/islower.c, line %d - %s\n"
           ,0x1d,"! islower( \'Z\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x20] & 0x200) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/islower.c, line %d - %s\n"
           ,0x1e,"! islower( \' \' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x40] & 0x200) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/islower.c, line %d - %s\n"
           ,0x1f,"! islower( \'@\' )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( islower( 'a' ) );
    TESTCASE( islower( 'z' ) );
    TESTCASE( ! islower( 'A' ) );
    TESTCASE( ! islower( 'Z' ) );
    TESTCASE( ! islower( ' ' ) );
    TESTCASE( ! islower( '@' ) );
    return TEST_RESULTS;
}